

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmPMove<(moira::Instr)184,(moira::Mode)10,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  char cVar12;
  ushort reg;
  Int i;
  Int i_00;
  Moira *this_00;
  uint ext;
  byte bVar13;
  uint uVar14;
  char *pcVar15;
  char *pcVar16;
  undefined1 local_44 [20];
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  this_00 = this;
  uVar8 = (*this->_vptr_Moira[6])();
  ext = uVar8 & 0xffff;
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) &&
     (bVar7 = isValidExtMMU(this_00,PMOVE,IXPC,op,ext), !bVar7)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)184,(moira::Mode)10,0>(this,str,addr,op);
    return;
  }
  reg = op & 7;
  uVar14 = ext >> 0xd;
  uVar10 = ext >> 10;
  pcVar15 = "%";
  pcVar16 = "";
  if ((str->style->syntax & ~GNU) != MOIRA_MIT) {
    pcVar15 = "";
  }
  pcVar9 = "fd";
  if ((ext >> 8 & 1) == 0) {
    pcVar9 = "";
  }
  if (uVar14 != 3) {
    if (uVar14 == 2) {
      switch(uVar10 & 7) {
      case 0:
        pcVar16 = "tc";
        break;
      case 1:
        pcVar16 = "drp";
        break;
      case 2:
        pcVar16 = "srp";
        break;
      case 3:
        pcVar16 = "crp";
        break;
      case 4:
        pcVar16 = "cal";
        break;
      case 5:
        pcVar16 = "val";
        break;
      case 6:
        pcVar16 = "scc";
        break;
      case 7:
        pcVar16 = "ac";
      }
    }
    else {
      if (ext >> 0xd != 0) {
LAB_003ef6b0:
        bVar7 = false;
        goto switchD_003ef6ef_default;
      }
      if ((uVar10 & 7) == 3) {
        pcVar16 = "tt1";
      }
      else {
        if ((uVar10 & 7) != 2) goto LAB_003ef6b0;
        pcVar16 = "tt0";
      }
    }
    bVar6 = true;
    bVar5 = false;
    goto switchD_003ef6ef_caseD_2;
  }
  bVar5 = false;
  bVar6 = false;
  bVar7 = false;
  switch(uVar10 & 7) {
  case 0:
    pcVar16 = "psr";
    break;
  case 1:
    pcVar16 = "pcsr";
    break;
  case 2:
  case 3:
    goto switchD_003ef6ef_caseD_2;
  case 4:
    pcVar16 = "bad";
    break;
  case 5:
    pcVar16 = "bac";
    break;
  default:
    goto switchD_003ef6ef_default;
  }
  bVar7 = true;
switchD_003ef6ef_default:
  bVar5 = bVar7;
  bVar6 = false;
switchD_003ef6ef_caseD_2:
  bVar13 = (byte)ext >> 2 & 7;
  cVar12 = 'p';
  lVar11 = 1;
  if ((ext >> 9 & 1) == 0) {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar12;
      cVar12 = "pmove"[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
    cVar12 = *pcVar9;
    while (cVar12 != '\0') {
      pcVar9 = pcVar9 + 1;
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar12;
      cVar12 = *pcVar9;
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    if (bVar5) {
      Op<(moira::Mode)10,2>((Ea<(moira::Mode)10,_2> *)local_44,this,reg,addr);
      StrWriter::operator<<(str,(Ea<(moira::Mode)10,_2> *)local_44);
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = ' ';
      }
    }
    if (bVar6) {
      Op<(moira::Mode)10,4>((Ea<(moira::Mode)10,_4> *)local_44,this,reg,addr);
      StrWriter::operator<<(str,(Ea<(moira::Mode)10,_4> *)local_44);
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = ' ';
      }
    }
    cVar12 = *pcVar15;
    while (cVar12 != '\0') {
      pcVar15 = pcVar15 + 1;
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = cVar12;
      cVar12 = *pcVar15;
    }
    cVar12 = *pcVar16;
    while (cVar12 != '\0') {
      pcVar16 = pcVar16 + 1;
      pcVar15 = str->ptr;
      str->ptr = pcVar15 + 1;
      *pcVar15 = cVar12;
      cVar12 = *pcVar16;
    }
    if ((uVar8 & 0x1800) != 0 && uVar14 == 3) {
      i.raw._1_3_ = 0;
      i.raw._0_1_ = bVar13;
      StrWriter::operator<<(str,i);
    }
  }
  else {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar12;
      cVar12 = "pmove"[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
    cVar12 = *pcVar9;
    while (cVar12 != '\0') {
      pcVar9 = pcVar9 + 1;
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar12;
      cVar12 = *pcVar9;
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    if ((uVar8 & 0x1800) != 0 && uVar14 == 3) {
      i_00.raw._1_3_ = 0;
      i_00.raw._0_1_ = bVar13;
      StrWriter::operator<<(str,i_00);
    }
    cVar12 = *pcVar15;
    while (cVar12 != '\0') {
      pcVar15 = pcVar15 + 1;
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = cVar12;
      cVar12 = *pcVar15;
    }
    cVar12 = *pcVar16;
    while (cVar12 != '\0') {
      pcVar16 = pcVar16 + 1;
      pcVar15 = str->ptr;
      str->ptr = pcVar15 + 1;
      *pcVar15 = cVar12;
      cVar12 = *pcVar16;
    }
    if (bVar5) {
      pcVar15 = str->ptr;
      str->ptr = pcVar15 + 1;
      *pcVar15 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar15 = str->ptr;
        str->ptr = pcVar15 + 1;
        *pcVar15 = ' ';
      }
      Op<(moira::Mode)10,2>((Ea<(moira::Mode)10,_2> *)local_44,this,reg,addr);
      StrWriter::operator<<(str,(Ea<(moira::Mode)10,_2> *)local_44);
    }
    if (bVar6) {
      pcVar15 = str->ptr;
      str->ptr = pcVar15 + 1;
      *pcVar15 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar15 = str->ptr;
        str->ptr = pcVar15 + 1;
        *pcVar15 = ' ';
      }
      Op<(moira::Mode)10,4>((Ea<(moira::Mode)10,_4> *)local_44,this,reg,addr);
      StrWriter::operator<<(str,(Ea<(moira::Mode)10,_4> *)local_44);
    }
  }
  return;
}

Assistant:

void
Moira::dasmPMove(StrWriter &str, u32 &addr, u16 op) const
{
    auto old  = addr;
    auto ext  = dasmIncRead<Word>(addr);
    auto reg  = _____________xxx (op);
    auto fmt  = xxx_____________ (ext);
    auto preg = ___xxx__________ (ext);
    auto nr   = ___________xxx__ (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    const char *prefix = str.style.syntax == Syntax::GNU_MIT || str.style.syntax == Syntax::MOIRA_MIT ? "%" : "";
    const char *suffix = (ext & 0x100) ? "fd" : "";
    const char *r = "";
    Size s = Size(Unsized);

    switch (fmt) {

        case 0:

            switch (preg) {

                case 0b010: r = "tt0";  s = Long; break;
                case 0b011: r = "tt1";  s = Long; break;
            }
            break;

        case 2:

            switch (preg) {

                case 0b000: r = "tc";   s = Long; break;
                case 0b001: r = "drp";  s = Long; break;
                case 0b010: r = "srp";  s = Long; break;
                case 0b011: r = "crp";  s = Long; break;
                case 0b100: r = "cal";  s = Long; break;
                case 0b101: r = "val";  s = Long; break;
                case 0b110: r = "scc";  s = Long; break;
                case 0b111: r = "ac";   s = Long; break;
            }
            break;

        case 3:

            switch (preg) {

                case 0b000: r = "psr";  s = Word; break;
                case 0b001: r = "pcsr"; s = Word; break;
                case 0b100: r = "bad";  s = Word; break;
                case 0b101: r = "bac";  s = Word; break;
            }
            break;
    }

    if (!(ext & 0x200)) {

        str << Ins<I>{} << suffix << str.tab;
        if (s == Word) str << Op<M, Word>(reg, addr) << Sep{};
        if (s == Long) str << Op<M, Long>(reg, addr) << Sep{};
        str << prefix << r;
        if (fmt == 3 && preg > 1) str << Int(nr);

    } else {

        str << Ins<I>{} << suffix << str.tab;
        if (fmt == 3 && preg > 1) str << Int(nr);
        str << prefix << r;
        if (s == Word) str << Sep{} << Op<M, Word>(reg, addr);
        if (s == Long) str << Sep{} << Op<M, Long>(reg, addr);
    }
}